

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O2

void __thiscall re2c::DFA::~DFA(DFA *this)

{
  State *this_00;
  Skeleton *this_01;
  
  while (this_00 = this->head, this_00 != (State *)0x0) {
    this->head = this_00->next;
    State::~State(this_00);
    operator_delete(this_00,0x58);
  }
  this_01 = this->skeleton;
  if (this_01 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_01);
  }
  operator_delete(this_01,0x90);
  std::__cxx11::string::~string((string *)&this->cond);
  std::__cxx11::string::~string((string *)&this->name);
  std::_Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>::~_Vector_base
            ((_Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_> *)this);
  return;
}

Assistant:

DFA::~DFA()
{
	State *s;

	while ((s = head))
	{
		head = s->next;
		delete s;
	}

	delete skeleton;
}